

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(char32_t *s,ostream *os)

{
  ostream *in_RDI;
  char32_t *unaff_retaddr;
  
  anon_unknown_37::PrintCStringTo<char32_t>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void PrintTo(const char32_t* s, ostream* os) { PrintCStringTo(s, os); }